

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int import_tls12_traffic_protection(ptls_t *tls,int is_enc,uint8_t **src,uint8_t *end)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_40;
  st_ptls_traffic_protection_t *tp;
  uint8_t *end_local;
  uint8_t **src_local;
  int is_enc_local;
  ptls_t *tls_local;
  
  if (is_enc == 0) {
    local_40 = &tls->traffic_protection;
  }
  else {
    local_40 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  }
  if ((ulong)((long)end - (long)*src) <
      tls->cipher_suite->aead->key_size + (tls->cipher_suite->aead->tls12).fixed_iv_size + 8) {
    tls_local._4_4_ = 0x32;
  }
  else {
    memcpy(local_40,*src,tls->cipher_suite->aead->key_size);
    *src = *src + tls->cipher_suite->aead->key_size;
    memcpy((local_40->dec).secret + 0x20,*src,(tls->cipher_suite->aead->tls12).fixed_iv_size);
    *src = *src + (tls->cipher_suite->aead->tls12).fixed_iv_size;
    iVar1 = ptls_decode64(&(local_40->dec).seq,src,end);
    if (iVar1 == 0) {
      if (((is_enc == 0) || ((tls->cipher_suite->aead->tls12).record_iv_size == 0)) ||
         (iVar1 = ptls_decode64(&(local_40->dec).tls12_enc_record_iv,src,end), iVar1 == 0)) {
        (local_40->dec).field_0x58 = (local_40->dec).field_0x58 & 0xfe | 1;
        ppVar2 = ptls_aead_new_direct
                           (tls->cipher_suite->aead,is_enc,local_40,(local_40->dec).secret + 0x20);
        (local_40->dec).aead = ppVar2;
        if (ppVar2 == (ptls_aead_context_t *)0x0) {
          tls_local._4_4_ = 0x201;
        }
        else {
          tls_local._4_4_ = 0;
        }
      }
      else {
        tls_local._4_4_ = 0x32;
      }
    }
    else {
      tls_local._4_4_ = 0x32;
    }
  }
  return tls_local._4_4_;
}

Assistant:

static int import_tls12_traffic_protection(ptls_t *tls, int is_enc, const uint8_t **src, const uint8_t *const end)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if ((size_t)(end - *src) < tls->cipher_suite->aead->key_size + tls->cipher_suite->aead->tls12.fixed_iv_size + sizeof(uint64_t))
        return PTLS_ALERT_DECODE_ERROR;

    /* set properties */
    memcpy(tp->secret, *src, tls->cipher_suite->aead->key_size);
    *src += tls->cipher_suite->aead->key_size;
    memcpy(tp->secret + PTLS_MAX_SECRET_SIZE, *src, tls->cipher_suite->aead->tls12.fixed_iv_size);
    *src += tls->cipher_suite->aead->tls12.fixed_iv_size;
    if (ptls_decode64(&tp->seq, src, end) != 0)
        return PTLS_ALERT_DECODE_ERROR;
    if (is_enc && tls->cipher_suite->aead->tls12.record_iv_size != 0) {
        if (ptls_decode64(&tp->tls12_enc_record_iv, src, end) != 0)
            return PTLS_ALERT_DECODE_ERROR;
    }
    tp->tls12 = 1;

    /* instantiate aead */
    if ((tp->aead = ptls_aead_new_direct(tls->cipher_suite->aead, is_enc, tp->secret, tp->secret + PTLS_MAX_SECRET_SIZE)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    return 0;
}